

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::int128::ToString_abi_cxx11_(string *__return_storage_ptr__,int128 *this)

{
  int128 v;
  int128 v_00;
  int64_t iVar1;
  fmtflags in_R8D;
  uint128 v_01;
  uint128 uVar2;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  string local_68;
  lts_20250127 *local_38;
  undefined8 uStack_30;
  undefined1 local_19;
  int128 *local_18;
  int128 *this_local;
  string *rep;
  
  local_19 = 0;
  local_18 = this;
  this_local = (int128 *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38 = *(lts_20250127 **)&this->v_;
  uStack_30 = *(undefined8 *)((long)&this->v_ + 8);
  v.v_._8_8_ = in_stack_ffffffffffffff50;
  v.v_._0_8_ = in_stack_ffffffffffffff48;
  iVar1 = Int128High64(local_38,v);
  if (iVar1 < 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"-");
  }
  v_00.v_._8_8_ = in_stack_ffffffffffffff50;
  v_00.v_._0_8_ = in_stack_ffffffffffffff48;
  uVar2 = anon_unknown_2::UnsignedAbsoluteValue(*(anon_unknown_2 **)&this->v_,v_00);
  v_01.lo_ = uVar2.hi_;
  v_01.hi_ = 2;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
            (&local_68,(void *)uVar2.lo_,v_01,in_R8D);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string int128::ToString() const {
  std::string rep;
  if (Int128High64(*this) < 0) rep = "-";
  rep.append(Uint128ToFormattedString(UnsignedAbsoluteValue(*this),
                                      std::ios_base::dec));
  return rep;
}